

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NFA.cpp
# Opt level: O2

void __thiscall NFALUT::NFALUT(NFALUT *this,int size,double _prob,double _logNT)

{
  int *piVar1;
  ulong uVar2;
  long lVar3;
  int i;
  long lVar4;
  double dVar5;
  
  this->LUTSize = size;
  uVar2 = 0xffffffffffffffff;
  if (-1 < size) {
    uVar2 = (ulong)(uint)size << 2;
  }
  piVar1 = (int *)operator_new__(uVar2);
  this->LUT = piVar1;
  this->prob = _prob;
  this->logNT = _logNT;
  *piVar1 = 1;
  lVar3 = 1;
  lVar4 = 1;
  do {
    if (size <= lVar4) {
      return;
    }
    this->LUT[lVar4] = size + 1;
    dVar5 = nfa(this,(int)lVar4,(int)lVar3);
    if (0.0 <= dVar5) {
LAB_00116da7:
      this->LUT[lVar4] = (int)lVar3;
    }
    else {
      lVar3 = (long)(int)lVar3;
      do {
        if (lVar4 <= lVar3) break;
        lVar3 = lVar3 + 1;
        dVar5 = nfa(this,(int)lVar4,(int)lVar3);
      } while (dVar5 < 0.0);
      if (0.0 <= dVar5) goto LAB_00116da7;
    }
    lVar4 = lVar4 + 1;
    size = this->LUTSize;
  } while( true );
}

Assistant:

NFALUT::NFALUT(int size, double _prob, double _logNT)
{
	LUTSize = size;
	LUT = new int[LUTSize];

	prob = _prob;
	logNT = _logNT;

	LUT[0] = 1;
	int j = 1;
	for (int i = 1; i<LUTSize; i++) {
		LUT[i] = LUTSize + 1;
		double ret = nfa(i, j);
		if (ret < 0) {
			while (j < i) {
				j++;
				ret = nfa(i, j);
				if (ret >= 0) break;
			} //end-while

			if (ret < 0) continue;
		} //end-if

		LUT[i] = j;
	} //end-for
}